

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::GetProperty
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,Var originalInstance,
          PropertyId propertyId,Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  byte bVar1;
  ScriptContext *this_00;
  bool bVar2;
  BOOL BVar3;
  Var pvVar4;
  RecyclableObject *pRVar5;
  long lVar6;
  anon_union_8_2_5e5949cc_for_SimplePropertyDescriptor_1 *paVar7;
  uint32 local_3c;
  Var *ppvStack_38;
  uint32 indexVal;
  
  ppvStack_38 = value;
  if (0 < (long)this->propertyCount) {
    paVar7 = &this->descriptors[0].field_1;
    lVar6 = 0;
    do {
      if (((((Type *)(paVar7 + -1))->Id).ptr)->pid == propertyId) {
        if ((paVar7->Attributes & 8) == 0) {
          pvVar4 = DynamicObject::GetSlot(instance,(int)lVar6);
          *ppvStack_38 = pvVar4;
          if (info == (PropertyValueInfo *)0x0) {
            return 1;
          }
          bVar1 = paVar7->Attributes;
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = (PropertyIndex)lVar6;
          info->m_attributes = bVar1;
          info->flags = InlineCacheNoFlags;
          return 1;
        }
        goto LAB_00e3c2ba;
      }
      lVar6 = lVar6 + 1;
      paVar7 = paVar7 + 2;
    } while (this->propertyCount != lVar6);
  }
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  bVar2 = DynamicObject::HasObjectArray(instance);
  if ((bVar2) &&
     (BVar3 = ScriptContext::IsNumericPropertyId(this_00,propertyId,&local_3c), BVar3 != 0)) {
    BVar3 = DynamicTypeHandler::GetItem
                      (&this->super_DynamicTypeHandler,instance,originalInstance,local_3c,
                       ppvStack_38,this_00);
  }
  else {
LAB_00e3c2ba:
    pRVar5 = ScriptContext::GetMissingPropertyResult(requestContext);
    *ppvStack_38 = pRVar5;
    BVar3 = 0;
  }
  return BVar3;
}

Assistant:

BOOL SimpleTypeHandler<size>::GetProperty(DynamicObject* instance, Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    *value = requestContext->GetMissingPropertyResult();
                    return false;
                }
                *value = instance->GetSlot(i);
                PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(i), descriptors[i].Attributes);
                return true;
            }
        }

        // Check numeric propertyId only if objectArray available
        uint32 indexVal;
        ScriptContext* scriptContext = instance->GetScriptContext();
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::GetItem(instance, originalInstance, indexVal, value, scriptContext);
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }